

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2_provider.hpp
# Opt level: O0

void __thiscall
digestpp::detail::sha2_provider<unsigned_long,_0UL>::transform
          (sha2_provider<unsigned_long,_0UL> *this,uchar *data,size_t num_blks)

{
  uint64_t uVar1;
  uint64_t uVar2;
  reference pvVar3;
  unsigned_long uVar4;
  long lVar5;
  unsigned_long T2;
  unsigned_long T1;
  value_type_conflict3 vStack_380;
  int t_2;
  unsigned_long h;
  unsigned_long g;
  unsigned_long f;
  unsigned_long e;
  unsigned_long d;
  unsigned_long c;
  unsigned_long b;
  unsigned_long a;
  int t_1;
  int t;
  unsigned_long W [80];
  int local_ac;
  int rounds;
  int i;
  unsigned_long M [16];
  size_t blk;
  size_t num_blks_local;
  uchar *data_local;
  sha2_provider<unsigned_long,_0UL> *this_local;
  
  for (M[0xf] = 0; M[0xf] < num_blks; M[0xf] = M[0xf] + 1) {
    for (local_ac = 0; local_ac < 0x10; local_ac = local_ac + 1) {
      uVar1 = byteswap(*(uint64_t *)(data + (M[0xf] * 0x10 + (long)local_ac) * 8));
      *(uint64_t *)(&rounds + (long)local_ac * 2) = uVar1;
    }
    for (a._4_4_ = 0; a._4_4_ < 0x10; a._4_4_ = a._4_4_ + 1) {
      *(undefined8 *)(&t_1 + (long)a._4_4_ * 2) = *(undefined8 *)(&rounds + (long)a._4_4_ * 2);
    }
    for (a._0_4_ = 0x10; (int)a < 0x50; a._0_4_ = (int)a + 1) {
      uVar1 = sha2_functions::sigma1(*(uint64_t *)(&t_1 + (long)((int)a + -2) * 2));
      lVar5 = *(long *)(&t_1 + (long)((int)a + -7) * 2);
      uVar2 = sha2_functions::sigma0(*(uint64_t *)(&t_1 + (long)((int)a + -0xf) * 2));
      *(uint64_t *)(&t_1 + (long)(int)a * 2) =
           uVar1 + lVar5 + uVar2 + *(long *)(&t_1 + (long)((int)a + -0x10) * 2);
    }
    pvVar3 = std::array<unsigned_long,_8UL>::operator[](&this->H,0);
    b = *pvVar3;
    pvVar3 = std::array<unsigned_long,_8UL>::operator[](&this->H,1);
    c = *pvVar3;
    pvVar3 = std::array<unsigned_long,_8UL>::operator[](&this->H,2);
    d = *pvVar3;
    pvVar3 = std::array<unsigned_long,_8UL>::operator[](&this->H,3);
    e = *pvVar3;
    pvVar3 = std::array<unsigned_long,_8UL>::operator[](&this->H,4);
    f = *pvVar3;
    pvVar3 = std::array<unsigned_long,_8UL>::operator[](&this->H,5);
    g = *pvVar3;
    pvVar3 = std::array<unsigned_long,_8UL>::operator[](&this->H,6);
    h = *pvVar3;
    pvVar3 = std::array<unsigned_long,_8UL>::operator[](&this->H,7);
    vStack_380 = *pvVar3;
    for (T1._4_4_ = 0; T1._4_4_ < 0x50; T1._4_4_ = T1._4_4_ + 1) {
      uVar1 = sha2_functions::sum1(f);
      uVar4 = sha2_functions::Ch<unsigned_long>(f,g,h);
      uVar2 = getK(this,T1._4_4_);
      lVar5 = vStack_380 + uVar1 + uVar4 + uVar2 + *(long *)(&t_1 + (long)T1._4_4_ * 2);
      uVar1 = sha2_functions::sum0(b);
      uVar4 = sha2_functions::Maj<unsigned_long>(b,c,d);
      vStack_380 = h;
      h = g;
      g = f;
      f = e + lVar5;
      e = d;
      d = c;
      c = b;
      b = lVar5 + uVar1 + uVar4;
    }
    pvVar3 = std::array<unsigned_long,_8UL>::operator[](&this->H,0);
    *pvVar3 = b + *pvVar3;
    pvVar3 = std::array<unsigned_long,_8UL>::operator[](&this->H,1);
    *pvVar3 = c + *pvVar3;
    pvVar3 = std::array<unsigned_long,_8UL>::operator[](&this->H,2);
    *pvVar3 = d + *pvVar3;
    pvVar3 = std::array<unsigned_long,_8UL>::operator[](&this->H,3);
    *pvVar3 = e + *pvVar3;
    pvVar3 = std::array<unsigned_long,_8UL>::operator[](&this->H,4);
    *pvVar3 = f + *pvVar3;
    pvVar3 = std::array<unsigned_long,_8UL>::operator[](&this->H,5);
    *pvVar3 = g + *pvVar3;
    pvVar3 = std::array<unsigned_long,_8UL>::operator[](&this->H,6);
    *pvVar3 = h + *pvVar3;
    pvVar3 = std::array<unsigned_long,_8UL>::operator[](&this->H,7);
    *pvVar3 = vStack_380 + *pvVar3;
  }
  return;
}

Assistant:

inline void transform(const unsigned char* data, size_t num_blks)
	{
		for (size_t blk = 0; blk < num_blks; blk++)
		{
			T M[16];
			for (int i = 0; i < 16; i++)
				M[i] = byteswap(reinterpret_cast<const T*>(data)[blk * 16 + i]);

			const int rounds = N == 512 ? 80 : 64;
			T W[rounds];
			for (int t = 0; t <= 15; t++)
				W[t] = M[t];
			for (int t = 16; t < rounds; t++)
				W[t] = sha2_functions::sigma1(W[t - 2]) + W[t - 7] + sha2_functions::sigma0(W[t - 15]) + W[t - 16];

			T a = H[0];
			T b = H[1];
			T c = H[2];
			T d = H[3];
			T e = H[4];
			T f = H[5];
			T g = H[6];
			T h = H[7];

			for (int t = 0; t < rounds; t++)
			{
				T T1 = h + sha2_functions::sum1(e) + sha2_functions::Ch(e, f, g) + getK(t) + W[t];
				T T2 = sha2_functions::sum0(a) + sha2_functions::Maj(a, b, c);
				h = g;
				g = f;
				f = e;
				e = d + T1;
				d = c;
				c = b;
				b = a;
				a = T1 + T2;

			}
			H[0] += a;
			H[1] += b;
			H[2] += c;
			H[3] += d;
			H[4] += e;
			H[5] += f;
			H[6] += g;
			H[7] += h;
		}

	}